

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

void __thiscall vec3<unsigned_int>::normalize(vec3<unsigned_int> *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar11 [16];
  
  uVar1 = (this->super_vec3_base).r;
  uVar3 = (this->super_vec3_base).g;
  fVar6 = (this->super_vec3_base).b;
  if (((((float)uVar1 != 2.1474836e+09) || (NAN((float)uVar1))) || ((float)uVar3 != 2.1474836e+09))
     || (((NAN((float)uVar3) || (fVar6 != 2.1474836e+09)) || (NAN(fVar6))))) {
    auVar9._0_8_ = (double)(float)uVar1;
    auVar9._8_8_ = (double)(float)uVar3;
    fVar5 = fVar6 / 4.2949673e+09 + fVar6 / 4.2949673e+09 + -1.0;
    auVar9 = divpd(auVar9,_DAT_0016a200);
    auVar10._0_4_ = (float)auVar9._0_8_ + (float)auVar9._0_8_ + -1.0;
    auVar10._4_4_ = (float)auVar9._8_8_ + (float)auVar9._8_8_ + -1.0;
    auVar10._8_8_ = 0;
    auVar9 = minps(_DAT_0016a1d0,auVar10);
    uVar8 = CONCAT44(~-(uint)(auVar10._4_4_ < -1.0) & auVar9._4_4_,
                     ~-(uint)(auVar10._0_4_ < -1.0) & auVar9._0_4_) |
            CONCAT44(-(uint)(auVar10._4_4_ < -1.0),-(uint)(auVar10._0_4_ < -1.0)) &
            0xbf800000bf800000;
    (this->super_vec3_base).r = (float)(int)uVar8;
    (this->super_vec3_base).g = (float)(int)(uVar8 >> 0x20);
    fVar6 = 1.0;
    if (fVar5 <= 1.0) {
      fVar6 = fVar5;
    }
    (this->super_vec3_base).b =
         (float)(-(uint)(fVar5 < -1.0) & 0xbf800000 | ~-(uint)(fVar5 < -1.0) & (uint)fVar6);
    vec3_base::base_normalize(&this->super_vec3_base);
    fVar5 = floorf(((this->super_vec3_base).b + 1.0) * 4.2949673e+09 * 0.5 + 0.5);
    uVar2 = (this->super_vec3_base).r;
    uVar4 = (this->super_vec3_base).g;
    fVar6 = floorf(((float)uVar2 + 1.0) * 4.2949673e+09 * 0.5 + 0.5);
    fVar7 = floorf(((float)uVar4 + 1.0) * 4.2949673e+09 * 0.5 + 0.5);
    auVar12._4_4_ = extraout_XMM0_Db;
    auVar12._0_4_ = fVar6;
    auVar12._8_4_ = extraout_XMM0_Db;
    auVar12._12_4_ = extraout_XMM0_Db_00;
    auVar11._8_8_ = auVar12._8_8_;
    auVar11._4_4_ = fVar7;
    auVar11._0_4_ = fVar6;
    auVar9 = minps(_DAT_0016a210,auVar11);
    (this->super_vec3_base).r = (float)(-(uint)(0.0 <= fVar6) & auVar9._0_4_);
    (this->super_vec3_base).g = (float)(-(uint)(0.0 <= fVar7) & auVar9._4_4_);
    fVar6 = 4.2949673e+09;
    if (fVar5 <= 4.2949673e+09) {
      fVar6 = fVar5;
    }
    (this->super_vec3_base).b = (float)(~-(uint)(fVar5 < 0.0) & (uint)fVar6);
  }
  return;
}

Assistant:

void normalize() {
        // Zero normals in range [-1, 1] can't be normalized
        if (gc_m[i] == r && gc_m[i] == g && gc_m[i] == b) {
            return;
        } else {
            r = (float)(r / (double)gc_s[i]) * 2.0f - 1.0f;
            g = (float)(g / (double)gc_s[i]) * 2.0f - 1.0f;
            b = (float)(b / (double)gc_s[i]) * 2.0f - 1.0f;
            clamp(-1.0f, 1.0f);
            base_normalize();
            r = (std::floor((r + 1.0f) * (float)gc_s[i] * 0.5f + 0.5f));
            g = (std::floor((g + 1.0f) * (float)gc_s[i] * 0.5f + 0.5f));
            b = (std::floor((b + 1.0f) * (float)gc_s[i] * 0.5f + 0.5f));
            clamp(0.0f, (float)gc_s[i]);
        }
    }